

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermAggregate * __thiscall
glslang::HlslParseContext::handleSamplerTextureCombine
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *argTex,TIntermTyped *argSampler)

{
  _Rb_tree_header *p_Var1;
  HlslParseContext *this_00;
  int iVar2;
  TPoolAllocator *pTVar3;
  TIntermAggregate *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint *puVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar5;
  long lVar6;
  mapped_type ptVar7;
  undefined4 extraout_var_05;
  TVariable *pTVar8;
  undefined4 extraout_var_06;
  mapped_type *pptVar9;
  undefined4 extraout_var_07;
  ulong uVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  _Rb_tree_header *p_Var13;
  uint uVar14;
  ulong uVar15;
  TMap<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>_>
  *pTVar16;
  TSourceLoc *pTVar17;
  longlong newId;
  TSampler local_f4;
  long local_f0;
  ulong local_e8;
  TSourceLoc *local_e0;
  TMap<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>_>
  *local_d8;
  HlslParseContext *local_d0;
  TType local_c8;
  
  local_e0 = loc;
  pTVar3 = GetThreadPoolAllocator();
  this_01 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar3,0x188);
  TIntermAggregate::TIntermAggregate(this_01,EOpConstructTextureSampler);
  iVar2 = (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(this_01);
  local_c8._vptr_TType = (_func_int **)argTex;
  std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
            ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
             CONCAT44(extraout_var,iVar2),(TIntermNode **)&local_c8);
  iVar2 = (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(this_01);
  local_c8._vptr_TType = (_func_int **)argSampler;
  std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
            ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
             CONCAT44(extraout_var_00,iVar2),(TIntermNode **)&local_c8);
  iVar2 = (*(argTex->super_TIntermNode)._vptr_TIntermNode[0x1e])(argTex);
  puVar4 = (uint *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x40))
                             ((long *)CONCAT44(extraout_var_01,iVar2));
  local_f4 = (TSampler)(*puVar4 | 0x100000);
  iVar2 = (*(argSampler->super_TIntermNode)._vptr_TIntermNode[0x1e])(argSampler);
  puVar4 = (uint *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x40))
                             ((long *)CONCAT44(extraout_var_02,iVar2));
  uVar14 = *puVar4;
  iVar2 = (*(argTex->super_TIntermNode)._vptr_TIntermNode[0xc])(argTex);
  plVar5 = (long *)CONCAT44(extraout_var_03,iVar2);
  if (plVar5 == (long *)0x0) {
    iVar2 = (*(argTex->super_TIntermNode)._vptr_TIntermNode[8])(argTex);
    plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 400))
                               ((long *)CONCAT44(extraout_var_04,iVar2));
    plVar5 = (long *)(**(code **)(*plVar5 + 0x60))(plVar5);
  }
  pTVar17 = local_e0;
  if (plVar5 == (long *)0x0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,local_e0,"unable to find texture symbol","","");
    goto LAB_003892b5;
  }
  local_f0 = (**(code **)(*plVar5 + 0x180))(plVar5);
  lVar6 = (**(code **)(*plVar5 + 0x180))(plVar5);
  p_Var1 = &(this->textureShadowVariant).
            super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  p_Var12 = (this->textureShadowVariant).
            super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var11 = &p_Var1->_M_header;
  for (; p_Var12 != (_Base_ptr)0x0; p_Var12 = (&p_Var12->_M_left)[*(long *)(p_Var12 + 1) < lVar6]) {
    if (lVar6 <= *(long *)(p_Var12 + 1)) {
      p_Var11 = p_Var12;
    }
  }
  uVar14 = uVar14 & 0x20000;
  p_Var12 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var11 != p_Var1) && (p_Var12 = p_Var11, lVar6 < *(long *)(p_Var11 + 1)))
  {
    p_Var12 = &p_Var1->_M_header;
  }
  pTVar16 = &this->textureShadowVariant;
  local_d8 = pTVar16;
  local_d0 = this;
  if ((_Rb_tree_header *)p_Var12 == p_Var1) {
    pTVar3 = GetThreadPoolAllocator();
    ptVar7 = (mapped_type)TPoolAllocator::allocate(pTVar3,0x10);
    *(undefined4 *)(ptVar7->symId)._M_elems = 0xffffffff;
    *(undefined4 *)((long)(ptVar7->symId)._M_elems + 4) = 0xffffffff;
    *(undefined4 *)((ptVar7->symId)._M_elems + 1) = 0xffffffff;
    *(undefined4 *)((long)(ptVar7->symId)._M_elems + 0xc) = 0xffffffff;
    local_e8 = (ulong)uVar14;
    local_c8._vptr_TType = (_func_int **)(**(code **)(*plVar5 + 0x180))(plVar5);
    pptVar9 = std::
              map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
              ::operator[](&pTVar16->
                            super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                           ,(key_type_conflict2 *)&local_c8);
    *pptVar9 = ptVar7;
    uVar15 = local_e8;
  }
  else {
    local_f0 = *(long *)(&(p_Var12[1]._M_parent)->_M_color + (ulong)(uVar14 >> 0x11) * 2);
    uVar15 = (ulong)uVar14;
  }
  this_00 = local_d0;
  if (local_f0 == -1) {
    TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
    iVar2 = (*(argTex->super_TIntermNode)._vptr_TIntermNode[0x1e])(argTex);
    TType::shallowCopy(&local_c8,(TType *)CONCAT44(extraout_var_05,iVar2));
    local_c8.sampler = (TSampler)((uint)local_c8.sampler & 0xfffdffff | (uint)uVar15);
    uVar14 = local_c8.qualifier._8_4_ & 0x7f;
    if (uVar14 == 0x10) {
      uVar10 = 3;
LAB_00389177:
      local_c8.qualifier._8_8_ = local_c8.qualifier._8_8_ & 0xffffffffffffff80 | uVar10;
    }
    else if (uVar14 == 0x11) {
      uVar10 = 4;
      goto LAB_00389177;
    }
    local_e8 = uVar15;
    lVar6 = (**(code **)(*plVar5 + 400))(plVar5);
    pTVar8 = makeInternalVariable(this_00,*(char **)(lVar6 + 8),&local_c8);
    (*(this_00->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
              (this_00,pTVar8);
    iVar2 = (*(pTVar8->super_TSymbol)._vptr_TSymbol[0xf])(pTVar8);
    local_f0 = CONCAT44(extraout_var_06,iVar2);
    uVar15 = local_e8;
  }
  pTVar16 = local_d8;
  if (local_f0 == -1) {
    __assert_fail("newId != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                  ,0xd2d,
                  "TIntermAggregate *glslang::HlslParseContext::handleSamplerTextureCombine(const TSourceLoc &, TIntermTyped *, TIntermTyped *)"
                 );
  }
  p_Var12 = (this_00->textureShadowVariant).
            super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var11 = &p_Var1->_M_header;
  for (; (_Rb_tree_header *)p_Var12 != (_Rb_tree_header *)0x0;
      p_Var12 = (&p_Var12->_M_left)[(long)*(size_t *)(p_Var12 + 1) < local_f0]) {
    if (local_f0 <= (long)*(size_t *)(p_Var12 + 1)) {
      p_Var11 = p_Var12;
    }
  }
  p_Var13 = p_Var1;
  if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
     (p_Var13 = (_Rb_tree_header *)p_Var11,
     local_f0 < (long)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
    p_Var13 = p_Var1;
  }
  if (p_Var13 == p_Var1) {
    local_c8._vptr_TType = (_func_int **)(**(code **)(*plVar5 + 0x180))(plVar5);
    pptVar9 = std::
              map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
              ::operator[](&pTVar16->
                            super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                           ,(key_type_conflict2 *)&local_c8);
    ptVar7 = *pptVar9;
    pptVar9 = std::
              map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
              ::operator[](&pTVar16->
                            super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                           ,&local_f0);
    *pptVar9 = ptVar7;
  }
  pptVar9 = std::
            map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
            ::operator[](&pTVar16->
                          super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                         ,&local_f0);
  *(long *)((long)((*pptVar9)->symId)._M_elems + (uVar15 >> 0xe & 0x3ffff)) = local_f0;
  iVar2 = (*(argTex->super_TIntermNode)._vptr_TIntermNode[0x1f])(argTex);
  puVar4 = (uint *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar2) + 0x48))
                             ((long *)CONCAT44(extraout_var_07,iVar2));
  *puVar4 = *puVar4 & 0xfffdffff | (uint)uVar15;
  local_f4 = (TSampler)((uint)local_f4 & 0xfffdffff | (uint)uVar15);
  (**(code **)(*plVar5 + 0x1a8))(plVar5,local_f0);
  pTVar17 = local_e0;
LAB_003892b5:
  if (plVar5 == (long *)0x0) {
    this_01 = (TIntermAggregate *)0x0;
  }
  else {
    TType::TType(&local_c8,&local_f4,EvqTemporary,(TArraySizes *)0x0);
    (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (this_01,&local_c8);
    (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
              (this_01,pTVar17);
  }
  return this_01;
}

Assistant:

TIntermAggregate* HlslParseContext::handleSamplerTextureCombine(const TSourceLoc& loc, TIntermTyped* argTex,
                                                                TIntermTyped* argSampler)
{
    TIntermAggregate* txcombine = new TIntermAggregate(EOpConstructTextureSampler);

    txcombine->getSequence().push_back(argTex);
    txcombine->getSequence().push_back(argSampler);

    TSampler samplerType = argTex->getType().getSampler();
    samplerType.combined = true;

    // TODO:
    // This block exists until the spec no longer requires shadow modes on texture objects.
    // It can be deleted after that, along with the shadowTextureVariant member.
    {
        const bool shadowMode = argSampler->getType().getSampler().shadow;

        TIntermSymbol* texSymbol = argTex->getAsSymbolNode();

        if (texSymbol == nullptr)
            texSymbol = argTex->getAsBinaryNode()->getLeft()->getAsSymbolNode();

        if (texSymbol == nullptr) {
            error(loc, "unable to find texture symbol", "", "");
            return nullptr;
        }

        // This forces the texture's shadow state to be the sampler's
        // shadow state.  This depends on downstream optimization to
        // DCE one variant in [shadow, nonshadow] if both are present,
        // or the SPIR-V module would be invalid.
        long long newId = texSymbol->getId();

        // Check to see if this texture has been given a shadow mode already.
        // If so, look up the one we already have.
        const auto textureShadowEntry = textureShadowVariant.find(texSymbol->getId());

        if (textureShadowEntry != textureShadowVariant.end())
            newId = textureShadowEntry->second->get(shadowMode);
        else
            textureShadowVariant[texSymbol->getId()] = NewPoolObject(tShadowTextureSymbols(), 1);

        // Sometimes we have to create another symbol (if this texture has been seen before,
        // and we haven't created the form for this shadow mode).
        if (newId == -1) {
            TType texType;
            texType.shallowCopy(argTex->getType());
            texType.getSampler().shadow = shadowMode;  // set appropriate shadow mode.
            globalQualifierFix(loc, texType.getQualifier());

            TVariable* newTexture = makeInternalVariable(texSymbol->getName(), texType);

            trackLinkage(*newTexture);

            newId = newTexture->getUniqueId();
        }

        assert(newId != -1);

        if (textureShadowVariant.find(newId) == textureShadowVariant.end())
            textureShadowVariant[newId] = textureShadowVariant[texSymbol->getId()];

        textureShadowVariant[newId]->set(shadowMode, newId);

        // Remember this shadow mode in the texture and the merged type.
        argTex->getWritableType().getSampler().shadow = shadowMode;
        samplerType.shadow = shadowMode;

        texSymbol->switchId(newId);
    }

    txcombine->setType(TType(samplerType, EvqTemporary));
    txcombine->setLoc(loc);

    return txcombine;
}